

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_audio.c
# Opt level: O3

void ws_audio_update(void *info,UINT32 length,DEV_SMPL **buffer)

{
  uint uVar1;
  ushort uVar2;
  short sVar3;
  DEV_SMPL *pDVar4;
  DEV_SMPL *pDVar5;
  long lVar6;
  bool bVar7;
  uint uVar8;
  char cVar9;
  byte bVar10;
  byte bVar11;
  ushort uVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  ushort *puVar23;
  byte *pbVar24;
  uint uVar25;
  long lVar26;
  int iVar27;
  
  if (length != 0) {
    pDVar4 = *buffer;
    pDVar5 = buffer[1];
    lVar6 = *(long *)((long)info + 0x48);
    uVar22 = *(ulong *)((long)info + 0x50);
    uVar2 = *(ushort *)((long)info + 0x68);
    uVar17 = 0;
    do {
      uVar22 = uVar22 + lVar6;
      uVar14 = uVar22 >> 0x20;
      if (uVar14 != 0) {
        do {
          if ((*(char *)((long)info + 0x5a) != '\0') && ((*(byte *)((long)info + 0xfc) & 0x40) != 0)
             ) {
            sVar3 = *(short *)((long)info + 0x5c);
            if (sVar3 < 0) {
              sVar3 = *(short *)((long)info + 0x58);
              uVar19 = (ushort)(*(short *)((long)info + 0x5e) + (short)*(char *)((long)info + 0x5a))
                       & 0x7ff;
              *(short *)((long)info + 0x5e) = (short)uVar19;
              *(int *)((long)info + 0x30) =
                   (int)(long)((1.0 / (float)(int)(0x800 - uVar19)) * *(float *)((long)info + 0x180)
                              );
            }
            *(short *)((long)info + 0x5c) = sVar3 + -1;
          }
          uVar19 = (int)uVar14 - 1;
          uVar14 = (ulong)uVar19;
        } while (uVar19 != 0);
      }
      uVar22 = uVar22 & 0xffffffff;
      *(ulong *)((long)info + 0x50) = uVar22;
      lVar26 = 0;
      iVar20 = 0;
      iVar27 = 0;
      do {
        if (*(char *)((long)info + lVar26 * 0x10 + 0x15) == '\0') {
          bVar11 = *(byte *)((long)info + 0xfc);
          if ((bVar11 & 0x20) == 0 || lVar26 != 1) {
            if ((bVar11 >> ((uint)lVar26 & 0x1f) & 1) == 0) goto LAB_0016a8bd;
            puVar23 = (ushort *)((long)info + lVar26 * 0x10 + 8);
            uVar15 = *(int *)(puVar23 + 2) + *(int *)(puVar23 + 4);
            uVar19 = uVar15 >> 0x10;
            cVar9 = (char)(uVar15 >> 0x10);
            if ((char)bVar11 < '\0' && lVar26 == 3) {
              *(uint *)(puVar23 + 2) = uVar15 & 0xffff;
              uVar15 = *(uint *)((long)info + 100);
              if (cVar9 != '\0') {
                uVar1 = ws_audio_update::noise_bit[*(byte *)((long)info + 0x60)] - 1;
                do {
                  uVar15 = uVar15 & uVar1;
                  if (uVar15 == 0) {
                    uVar15 = uVar1;
                  }
                  if ((uVar15 & ws_audio_update::noise_mask[*(byte *)((long)info + 0x60)]) == 0) {
                    uVar25 = 0;
                  }
                  else {
                    uVar25 = uVar15 & ws_audio_update::noise_mask[*(byte *)((long)info + 0x60)];
                    uVar8 = 0;
                    do {
                      uVar18 = uVar8;
                      uVar21 = uVar25 & 1;
                      bVar7 = 1 < uVar25;
                      uVar25 = uVar25 >> 1;
                      uVar8 = uVar18 ^ uVar21;
                    } while (bVar7);
                    uVar25 = ws_audio_update::noise_bit[*(byte *)((long)info + 0x60)];
                    if (uVar18 == uVar21) {
                      uVar25 = 0;
                    }
                  }
                  bVar11 = (char)uVar19 - 1;
                  uVar19 = (uint)bVar11;
                  uVar15 = (uVar15 | uVar25) >> 1;
                } while (bVar11 != 0);
                *(uint *)((long)info + 100) = uVar15;
              }
              *(char *)((long)info + 0xfe) = (char)uVar15;
              *(byte *)((long)info + 0xff) = (byte)(uVar15 >> 8) & 0x7f;
              uVar19 = (uint)(byte)puVar23[1];
              iVar13 = 0x7f;
              if ((uVar15 & 1) == 0) {
                iVar13 = -0x80;
              }
            }
            else {
              *(uint *)(puVar23 + 2) = uVar15 & 0xffff;
              bVar10 = cVar9 + (char)puVar23[6];
              bVar11 = bVar10 & 0x1f;
              *(byte *)(puVar23 + 6) = bVar11;
              bVar11 = *(byte *)(*(long *)((long)info + 0x170) +
                                ((ulong)(bVar11 >> 1) | (ulong)(*puVar23 & 0xfffffff0)));
              uVar12 = (bVar11 & 0xf) << 4;
              if ((bVar10 & 1) != 0) {
                uVar12 = bVar11 & 0xfff0;
              }
              uVar19 = (uint)(byte)puVar23[1];
              iVar13 = (int)(short)(uVar12 - 0x80);
            }
            iVar16 = uVar19 * iVar13;
            pbVar24 = (byte *)((long)puVar23 + 3);
          }
          else {
            iVar13 = *(byte *)((long)info + 0xf5) - 0x80;
            iVar16 = (uint)*(byte *)((long)info + 0x6a) * iVar13;
            pbVar24 = (byte *)((long)info + 0x6b);
          }
          iVar27 = iVar27 + iVar16;
          iVar20 = iVar20 + (uint)*pbVar24 * iVar13;
        }
LAB_0016a8bd:
        lVar26 = lVar26 + 1;
      } while (lVar26 != 4);
      pDVar4[uVar17] = iVar27 * (uint)uVar2;
      pDVar5[uVar17] = iVar20 * (uint)uVar2;
      uVar17 = uVar17 + 1;
    } while (uVar17 != length);
  }
  return;
}

Assistant:

static void ws_audio_update(void* info, UINT32 length, DEV_SMPL** buffer)
{
	wsa_state* chip = (wsa_state*)info;
	DEV_SMPL* bufL;
	DEV_SMPL* bufR;
	UINT32 i;
	UINT8 ch, cnt;
	INT16 w;	// could fit into INT8
	DEV_SMPL l, r;

	bufL = buffer[0];
	bufR = buffer[1];
	for (i=0; i<length; i++)
	{
		UINT32 swpCount;
		
		RC_STEP(&chip->HBlankTmr);
		for (swpCount = RC_GET_VAL(&chip->HBlankTmr); swpCount > 0; swpCount --)
			ws_audio_process(chip);
		RC_MASK(&chip->HBlankTmr);

		l = r = 0;

		for (ch=0; ch<4; ch++)
		{
			if (chip->ws_audio[ch].Muted)
				continue;
			
			if ((ch==1) && (SNDMOD&0x20))
			{
				// Voice出力
				w = chip->ws_ioRam[0x89];
				w -= 0x80;
				l += chip->PCMVolumeLeft  * w;
				r += chip->PCMVolumeRight * w;
			}
			else if (SNDMOD&(1<<ch))
			{
				if ((ch==3) && (SNDMOD&0x80))
				{
					//Noise

					//OSWANの擬似乱数の処理と同等のつもり
#define BIT(n) (1<<n)
					static const UINT32 noise_mask[8] =
					{
						BIT(0)|BIT(1),
						BIT(0)|BIT(1)|BIT(4)|BIT(5),
						BIT(0)|BIT(1)|BIT(3)|BIT(4),
						BIT(0)|BIT(1)|BIT(4)|BIT(6),
						BIT(0)|BIT(2),
						BIT(0)|BIT(3),
						BIT(0)|BIT(4),
						BIT(0)|BIT(2)|BIT(3)|BIT(4)
					};

					static const UINT32 noise_bit[8] =
					{
						BIT(15),
						BIT(14),
						BIT(13),
						BIT(12),
						BIT(11),
						BIT(10),
						BIT(9),
						BIT(8)
					};

					UINT32 Masked, XorReg;

					chip->ws_audio[ch].offset += chip->ws_audio[ch].delta;
					cnt = chip->ws_audio[ch].offset>>16;
					chip->ws_audio[ch].offset &= 0xffff;
					while (cnt > 0)
					{
						cnt--;

						chip->NoiseRng &= noise_bit[chip->NoiseType]-1;
						if (!chip->NoiseRng) chip->NoiseRng = noise_bit[chip->NoiseType]-1;

						Masked = chip->NoiseRng & noise_mask[chip->NoiseType];
						XorReg = 0;
						while (Masked)
						{
							XorReg ^= Masked&1;
							Masked >>= 1;
						}
						if (XorReg)
							chip->NoiseRng |= noise_bit[chip->NoiseType];
						chip->NoiseRng >>= 1;
					}

					PCSRL = (byte)(chip->NoiseRng&0xff);
					PCSRH = (byte)((chip->NoiseRng>>8)&0x7f);

					w = (chip->NoiseRng&1)? 0x7f:-0x80;
					l += chip->ws_audio[ch].lvol * w;
					r += chip->ws_audio[ch].rvol * w;
				}
				else
				{
					chip->ws_audio[ch].offset += chip->ws_audio[ch].delta;
					cnt = chip->ws_audio[ch].offset>>16;
					chip->ws_audio[ch].offset &= 0xffff;
					chip->ws_audio[ch].pos += cnt;
					chip->ws_audio[ch].pos &= 0x1f;
					w = chip->ws_internalRam[(chip->ws_audio[ch].wave&0xFFF0) + (chip->ws_audio[ch].pos>>1)];
					if ((chip->ws_audio[ch].pos&1) == 0)
						w = (w<<4)&0xf0;	//下位ニブル
					else
						w = w&0xf0;			//上位ニブル
					w -= 0x80;
					l += chip->ws_audio[ch].lvol * w;
					r += chip->ws_audio[ch].rvol * w;
				}
			}
		}

		bufL[i] = l * chip->MainVolume;
		bufR[i] = r * chip->MainVolume;
	}
}